

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsv.hpp
# Opt level: O2

void remora::bindings::
     trsv_impl<false,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::vector<double,remora::cpu_tag>>
               (long A,long *b)

{
  double dVar1;
  long lVar2;
  long lVar3;
  invalid_argument *this;
  double *pdVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  value_type value;
  long local_60;
  long local_58;
  undefined8 local_50;
  long local_48;
  long local_40;
  undefined8 local_38;
  
  lVar2 = *(long *)(A + 8);
  pdVar4 = *(double **)(A + 0x10);
  lVar3 = *b;
  lVar6 = b[1] - lVar3;
  lVar5 = 0;
  while( true ) {
    if (lVar6 >> 3 == lVar5) {
      return;
    }
    local_38 = 1;
    local_60 = *(long *)(A + 8) * lVar5 * 8 + *(long *)(A + 0x10);
    local_50 = 1;
    local_58 = lVar5;
    local_48 = lVar3;
    local_40 = lVar5;
    dot<remora::dense_vector_adaptor<double,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_vector_adaptor<double_const,remora::continuous_dense_tag,remora::cpu_tag>,double>
              (&local_48,&local_60,&value);
    lVar3 = *b;
    dVar7 = *(double *)(lVar3 + lVar5 * 8) - value;
    *(double *)(lVar3 + lVar5 * 8) = dVar7;
    dVar1 = *pdVar4;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) break;
    *(double *)(lVar3 + lVar5 * 8) = dVar7 / dVar1;
    lVar5 = lVar5 + 1;
    pdVar4 = pdVar4 + lVar2 + 1;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"[TRSV] Matrix is singular!");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void trsv_impl(
	matrix_expression<MatA, cpu_tag> const& A,
	vector_expression<V, cpu_tag> &b,
	lower, row_major, left
) {
	REMORA_SIZE_CHECK(A().size1() == A().size2());
	REMORA_SIZE_CHECK(A().size2() == b().size());

	typedef typename V::value_type value_type;
	auto A_elem = A().elements();
	std::size_t size = b().size();
	for (std::size_t n = 0; n < size; ++ n) {
		value_type value;
		bindings::dot(
			subrange(b,0,n), subrange(row(A,n),0,n), value, 
			typename MatA::evaluation_category::tag(),
			typename V::evaluation_category::tag()
		);
		b()(n) -= value;
		if(!Unit){
			if(A_elem(n, n) == value_type()){//matrix is singular
				throw std::invalid_argument("[TRSV] Matrix is singular!");
			}
			b()(n) /= A_elem(n, n);
		}
	}
}